

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

_Bool is_neighbor_blk_larger_than_cur_blk(MACROBLOCKD *xd,BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  BLOCK_SIZE above_bsize;
  BLOCK_SIZE left_bsize;
  int cur_blk_area;
  BLOCK_SIZE bsize_local;
  MACROBLOCKD *xd_local;
  _Bool local_1;
  
  if (((xd->left_available & 1U) == 0) ||
     (BVar1 = xd->left_mbmi->bsize,
     (uint)block_size_high[BVar1] * (uint)block_size_wide[BVar1] <=
     (uint)block_size_high[bsize] * (uint)block_size_wide[bsize])) {
    if (((xd->up_available & 1U) == 0) ||
       (BVar1 = xd->above_mbmi->bsize,
       (uint)block_size_high[BVar1] * (uint)block_size_wide[BVar1] <=
       (uint)block_size_high[bsize] * (uint)block_size_wide[bsize])) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static inline bool is_neighbor_blk_larger_than_cur_blk(const MACROBLOCKD *xd,
                                                       BLOCK_SIZE bsize) {
  const int cur_blk_area = (block_size_high[bsize] * block_size_wide[bsize]);
  if (xd->left_available) {
    const BLOCK_SIZE left_bsize = xd->left_mbmi->bsize;
    if (block_size_high[left_bsize] * block_size_wide[left_bsize] >
        cur_blk_area)
      return true;
  }

  if (xd->up_available) {
    const BLOCK_SIZE above_bsize = xd->above_mbmi->bsize;
    if (block_size_high[above_bsize] * block_size_wide[above_bsize] >
        cur_blk_area)
      return true;
  }
  return false;
}